

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraph::TransformNode::print(TransformNode *this,ostream *cout,int depth)

{
  Node *pNVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"TransformNode @ ",0x10);
  poVar2 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (-1 < depth) {
    iVar3 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"closed = ",9);
  bVar4 = SUB81(cout,0);
  poVar2 = std::ostream::_M_insert<bool>(bVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (-1 < depth) {
    iVar3 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"numTimeSteps = ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar6 = (ulong)(depth + 1);
  if (-1 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"child = ",8);
  pNVar1 = (this->child).ptr;
  (*(pNVar1->super_RefCount)._vptr_RefCount[4])(pNVar1,cout,(ulong)(depth + 1));
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + bVar4);
  std::ostream::put(bVar4);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::TransformNode::print(std::ostream& cout, int depth)
  {
    cout << "TransformNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    tab(cout, depth+1); cout << "numTimeSteps = " << spaces.size() << std::endl;
    tab(cout, depth+1); cout << "child = "; child->print(cout,depth+1);
    tab(cout, depth); cout << "}" << std::endl;
  }